

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_seed(Curl_easy *data)

{
  _Bool _Var1;
  int iVar2;
  char *local_178;
  uchar local_168 [4];
  int len;
  uchar randb [64];
  char fname [256];
  int nread;
  Curl_easy *data_local;
  
  if (Curl_ossl_seed::ssl_seeded) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    _Var1 = rand_enough();
    if (_Var1) {
      Curl_ossl_seed::ssl_seeded = true;
      data_local._4_4_ = CURLE_OK;
    }
    else {
      if ((data->set).str[0x23] == (char *)0x0) {
        local_178 = "/dev/urandom";
      }
      else {
        local_178 = (data->set).str[0x23];
      }
      data_local._4_4_ = RAND_load_file(local_178,0x400);
      _Var1 = rand_enough();
      if (!_Var1) {
        do {
          iVar2 = RAND_bytes(local_168,0x40);
          if (iVar2 == 0) break;
          RAND_add(local_168,0x40,32.0);
          _Var1 = rand_enough();
        } while (((_Var1 ^ 0xffU) & 1) != 0);
        randb[0x38] = '\0';
        RAND_file_name((char *)(randb + 0x38),0x100);
        if (randb[0x38] != '\0') {
          iVar2 = RAND_load_file((char *)(randb + 0x38),0x400);
          _Var1 = rand_enough();
          if (_Var1) {
            return iVar2 + data_local._4_4_;
          }
        }
        Curl_infof(data,"libcurl is now using a weak random seed!\n");
        data_local._4_4_ = CURLE_SSL_CONNECT_ERROR;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode Curl_ossl_seed(struct Curl_easy *data)
{
  /* we have the "SSL is seeded" boolean static to prevent multiple
     time-consuming seedings in vain */
  static bool ssl_seeded = FALSE;
  int nread=0;
  char fname[256];

  if(ssl_seeded)
    return CURLE_OK;

  if(rand_enough()) {
    /* OpenSSL 1.1.0+ will return here */
    ssl_seeded = TRUE;
    return CURLE_OK;
  }

#ifndef RANDOM_FILE
  /* if RANDOM_FILE isn't defined, we only perform this if an option tells
     us to! */
  if(data->set.str[STRING_SSL_RANDOM_FILE])
#define RANDOM_FILE "" /* doesn't matter won't be used */
#endif
  {
    /* let the option override the define */
    nread += RAND_load_file((data->set.str[STRING_SSL_RANDOM_FILE]?
                             data->set.str[STRING_SSL_RANDOM_FILE]:
                             RANDOM_FILE),
                            RAND_LOAD_LENGTH);
    if(rand_enough())
      return nread;
  }

#if defined(HAVE_RAND_EGD)
  /* only available in OpenSSL 0.9.5 and later */
  /* EGD_SOCKET is set at configure time or not at all */
#ifndef EGD_SOCKET
  /* If we don't have the define set, we only do this if the egd-option
     is set */
  if(data->set.str[STRING_SSL_EGDSOCKET])
#define EGD_SOCKET "" /* doesn't matter won't be used */
#endif
  {
    /* If there's an option and a define, the option overrides the
       define */
    int ret = RAND_egd(data->set.str[STRING_SSL_EGDSOCKET]?
                       data->set.str[STRING_SSL_EGDSOCKET]:EGD_SOCKET);
    if(-1 != ret) {
      nread += ret;
      if(rand_enough())
        return nread;
    }
  }
#endif

  /* If we get here, it means we need to seed the PRNG using a "silly"
     approach! */
  do {
    unsigned char randb[64];
    int len = sizeof(randb);
    if(!RAND_bytes(randb, len))
      break;
    RAND_add(randb, len, (len >> 1));
  } while(!rand_enough());

  /* generates a default path for the random seed file */
  fname[0]=0; /* blank it first */
  RAND_file_name(fname, sizeof(fname));
  if(fname[0]) {
    /* we got a file name to try */
    nread += RAND_load_file(fname, RAND_LOAD_LENGTH);
    if(rand_enough())
      return nread;
  }

  infof(data, "libcurl is now using a weak random seed!\n");
  return CURLE_SSL_CONNECT_ERROR; /* confusing error code */
}